

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-typed-test.cc
# Opt level: O1

char * __thiscall
testing::internal::TypedTestSuitePState::VerifyRegisteredTestNames
          (TypedTestSuitePState *this,char *test_suite_name,char *file,int line,
          char *registered_tests)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Base_ptr p_Var4;
  _Alloc_hider _Var5;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var6;
  int iVar7;
  char *pcVar8;
  size_t sVar9;
  _Alloc_hider _Var10;
  const_iterator cVar11;
  const_iterator cVar12;
  _Rb_tree_node_base *p_Var13;
  _Rb_tree_node_base *p_Var14;
  undefined8 extraout_RAX;
  int line_00;
  ulong uVar15;
  long lVar16;
  char *pcVar17;
  ostream *poVar18;
  pointer __k;
  char *pcVar19;
  Message errors;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  name_vec;
  string local_110;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f0;
  TypedTestSuitePState *local_e8;
  uint local_dc;
  undefined1 local_d8 [32];
  _Base_ptr local_b8;
  size_t local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  internal *local_90;
  char *local_88;
  _Base_ptr local_80;
  CodeLocation local_78;
  string local_50;
  
  line_00 = line;
  local_e8 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d8,file,(allocator<char> *)&local_110);
  paVar1 = &local_78.file.field_2;
  local_78.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,local_d8._0_8_,(char *)(local_d8._0_8_ + local_d8._8_8_));
  local_78.line = line;
  RegisterTypeParameterizedTestSuite(test_suite_name,&local_78);
  local_dc = line;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.file._M_dataplus._M_p,local_78.file.field_2._M_allocated_capacity + 1);
  }
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_d8 + 0x10);
  local_90 = (internal *)file;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._0_8_ != paVar1) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  *local_e8 = (TypedTestSuitePState)0x1;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar17 = registered_tests + -1;
  local_88 = registered_tests;
  do {
    pbVar2 = (byte *)(pcVar17 + 1);
    pcVar17 = pcVar17 + 1;
    iVar7 = isspace((uint)*pbVar2);
  } while (iVar7 != 0);
  do {
    pcVar8 = strchr(pcVar17,0x2c);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    if (pcVar8 == (char *)0x0) {
      sVar9 = strlen(pcVar17);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,pcVar17,pcVar17 + sVar9);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,pcVar17,pcVar8);
    }
    _Var10._M_p = local_110._M_dataplus._M_p;
    if (local_110._M_string_length != 0) {
      pcVar8 = local_110._M_dataplus._M_p + local_110._M_string_length;
      do {
        _Var5._M_p = local_110._M_dataplus._M_p;
        iVar7 = isspace((uint)(byte)pcVar8[-1]);
        _Var10._M_p = _Var5._M_p;
        if (iVar7 == 0) break;
        pcVar19 = pcVar8 + -1;
        uVar15 = (long)pcVar19 - (long)_Var5._M_p;
        std::__cxx11::string::_M_erase((ulong)&local_110,uVar15);
        pcVar8 = local_110._M_dataplus._M_p + uVar15;
        _Var10._M_p = local_110._M_dataplus._M_p;
      } while (pcVar19 != _Var5._M_p);
    }
    paVar3 = &local_110.field_2;
    local_d8._0_8_ = _Var10._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var10._M_p == paVar3) {
      local_d8._24_8_ = local_110.field_2._8_8_;
      local_d8._0_8_ = paVar1;
    }
    local_d8._17_7_ = local_110.field_2._M_allocated_capacity._1_7_;
    local_d8[0x10] = local_110.field_2._M_local_buf[0];
    local_d8._8_8_ = local_110._M_string_length;
    local_110._M_string_length = 0;
    local_110.field_2._M_local_buf[0] = '\0';
    local_110._M_dataplus._M_p = (pointer)paVar3;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._0_8_ != paVar1) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar3) {
      operator_delete(local_110._M_dataplus._M_p,
                      CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                               local_110.field_2._M_local_buf[0]) + 1);
    }
    pcVar17 = strchr(pcVar17,0x2c);
    if (pcVar17 == (char *)0x0) {
      pcVar17 = (char *)0x0;
    }
    else {
      do {
        pbVar2 = (byte *)(pcVar17 + 1);
        pcVar17 = pcVar17 + 1;
        iVar7 = isspace((uint)*pbVar2);
      } while (iVar7 != 0);
    }
  } while (pcVar17 != (char *)0x0);
  Message::Message((Message *)&local_f0);
  p_Var4 = (_Base_ptr)(local_d8 + 8);
  local_d8._8_8_ = local_d8._8_8_ & 0xffffffff00000000;
  local_d8._16_8_ = 0;
  local_b0 = 0;
  local_d8._24_8_ = p_Var4;
  local_b8 = p_Var4;
  if (local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    poVar18 = (ostream *)(local_f0._M_head_impl + 0x10);
    this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
               *)(local_e8 + 8);
    local_80 = (_Base_ptr)(local_e8 + 0x10);
    __k = local_a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      cVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_d8,__k);
      if (cVar11._M_node == p_Var4) {
        cVar12 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                 ::find(this_00,__k);
        if (cVar12._M_node == local_80) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,"No test named ",0xe);
          lVar16 = 0x22;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar18,(__k->_M_dataplus)._M_p,__k->_M_string_length);
          pcVar17 = " can be found in this test suite.\n";
          goto LAB_0011d144;
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_d8,__k);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"Test ",5);
        lVar16 = 0x1b;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,(__k->_M_dataplus)._M_p,__k->_M_string_length);
        pcVar17 = " is listed more than once.\n";
LAB_0011d144:
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,pcVar17,lVar16);
      }
      __k = __k + 1;
    } while (__k != local_a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  }
  p_Var14 = *(_Rb_tree_node_base **)(local_e8 + 0x20);
  p_Var13 = (_Rb_tree_node_base *)(local_e8 + 0x10);
  if (p_Var14 != p_Var13) {
    do {
      cVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_d8,(key_type *)(p_Var14 + 1));
      if (cVar11._M_node == p_Var4) {
        poVar18 = (ostream *)(local_f0._M_head_impl + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"You forgot to list test ",0x18);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,*(char **)(p_Var14 + 1),(long)p_Var14[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,".\n",2);
      }
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    } while (p_Var14 != p_Var13);
  }
  _Var6._M_head_impl = local_f0._M_head_impl;
  StringStreamToString(&local_110,local_f0._M_head_impl);
  pcVar17 = local_88;
  if (local_110._M_string_length != 0) {
    FormatFileLocation_abi_cxx11_(&local_50,local_90,(char *)(ulong)local_dc,line_00);
    VerifyRegisteredTestNames();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,
                      CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                               local_110.field_2._M_local_buf[0]) + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_d8);
    if (local_f0._M_head_impl != (stringstream *)0x0) {
      (**(code **)(*(long *)local_f0._M_head_impl + 8))();
    }
    local_f0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a8);
    _Unwind_Resume(extraout_RAX);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,
                    CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                             local_110.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_d8);
  if (_Var6._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)_Var6._M_head_impl + 8))(_Var6._M_head_impl);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  return pcVar17;
}

Assistant:

const char* TypedTestSuitePState::VerifyRegisteredTestNames(
    const char* test_suite_name, const char* file, int line,
    const char* registered_tests) {
  RegisterTypeParameterizedTestSuite(test_suite_name, CodeLocation(file, line));

  typedef RegisteredTestsMap::const_iterator RegisteredTestIter;
  registered_ = true;

  std::vector<std::string> name_vec = SplitIntoTestNames(registered_tests);

  Message errors;

  std::set<std::string> tests;
  for (std::vector<std::string>::const_iterator name_it = name_vec.begin();
       name_it != name_vec.end(); ++name_it) {
    const std::string& name = *name_it;
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    if (registered_tests_.count(name) != 0) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test suite.\n";
    }
  }

  for (RegisteredTestIter it = registered_tests_.begin();
       it != registered_tests_.end(); ++it) {
    if (tests.count(it->first) == 0) {
      errors << "You forgot to list test " << it->first << ".\n";
    }
  }

  const std::string& errors_str = errors.GetString();
  if (!errors_str.empty()) {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}